

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O2

bool __thiscall
icu_63::number::impl::NumberStringBuilder::nextFieldPosition
          (NumberStringBuilder *this,FieldPosition *fp,UErrorCode *status)

{
  bool bVar1;
  UNumberFormatFields UVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  UNumberFormatFields UVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ValueOrHeapArray<UNumberFormatFields> *pVVar10;
  long lVar11;
  
  UVar2 = fp->fField;
  if (UVar2 != ~UNUM_INTEGER_FIELD) {
    if (UVar2 < UNUM_FIELD_COUNT) {
      iVar7 = fp->fEndIndex;
      iVar3 = this->fZero;
      uVar8 = (ulong)iVar3;
      lVar9 = (long)this->fLength + uVar8;
      bVar1 = this->fUsingHeap;
      iVar5 = -1;
      bVar4 = false;
      for (lVar11 = (long)(iVar3 + iVar7); lVar11 <= lVar9; lVar11 = lVar11 + 1) {
        UVar6 = UNUM_FIELD_COUNT;
        if (lVar11 < lVar9) {
          pVVar10 = &this->fFields;
          if ((bVar1 & 1U) != 0) {
            pVVar10 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
          }
          UVar6 = pVVar10->value[lVar11];
        }
        if (((bool)(bVar4 ^ 1U)) || (UVar2 == UVar6)) {
          if ((bool)((bVar4 ^ 1U) & UVar2 == UVar6)) {
            fp->fBeginIndex = iVar7;
            uVar8 = (ulong)(uint)this->fZero;
            bVar4 = true;
          }
          if ((UVar6 & ~UNUM_DECIMAL_SEPARATOR_FIELD) == UNUM_INTEGER_FIELD) {
            iVar5 = (iVar3 + 1 + iVar7) - (int)uVar8;
          }
        }
        else if ((UVar2 != UNUM_INTEGER_FIELD) || (UVar6 != UNUM_GROUPING_SEPARATOR_FIELD)) {
          fp->fEndIndex = iVar7;
          break;
        }
        iVar7 = iVar7 + 1;
      }
      if (UVar2 != UNUM_FRACTION_FIELD) {
        return bVar4;
      }
      if (bVar4 != false) {
        return bVar4;
      }
      if (iVar5 == -1) {
        return false;
      }
      fp->fBeginIndex = iVar5;
      fp->fEndIndex = iVar5;
    }
    else {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return false;
}

Assistant:

bool NumberStringBuilder::nextFieldPosition(FieldPosition& fp, UErrorCode& status) const {
    int32_t rawField = fp.getField();

    if (rawField == FieldPosition::DONT_CARE) {
        return FALSE;
    }

    if (rawField < 0 || rawField >= UNUM_FIELD_COUNT) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return FALSE;
    }

    auto field = static_cast<Field>(rawField);

    bool seenStart = false;
    int32_t fractionStart = -1;
    int32_t startIndex = fp.getEndIndex();
    for (int i = fZero + startIndex; i <= fZero + fLength; i++) {
        Field _field = UNUM_FIELD_COUNT;
        if (i < fZero + fLength) {
            _field = getFieldPtr()[i];
        }
        if (seenStart && field != _field) {
            // Special case: GROUPING_SEPARATOR counts as an INTEGER.
            if (field == UNUM_INTEGER_FIELD && _field == UNUM_GROUPING_SEPARATOR_FIELD) {
                continue;
            }
            fp.setEndIndex(i - fZero);
            break;
        } else if (!seenStart && field == _field) {
            fp.setBeginIndex(i - fZero);
            seenStart = true;
        }
        if (_field == UNUM_INTEGER_FIELD || _field == UNUM_DECIMAL_SEPARATOR_FIELD) {
            fractionStart = i - fZero + 1;
        }
    }

    // Backwards compatibility: FRACTION needs to start after INTEGER if empty.
    // Do not return that a field was found, though, since there is not actually a fraction part.
    if (field == UNUM_FRACTION_FIELD && !seenStart && fractionStart != -1) {
        fp.setBeginIndex(fractionStart);
        fp.setEndIndex(fractionStart);
    }

    return seenStart;
}